

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vfp_helper.c
# Opt level: O0

float32 frint_s(float32 f,float_status *fpst,int intsize)

{
  uint uVar1;
  uint32_t uVar2;
  float32 value;
  uint32_t uVar3;
  uint32_t frac;
  uint32_t sign;
  uint32_t exp;
  int old_flags;
  int intsize_local;
  float_status *fpst_local;
  float32 f_local;
  
  uVar1 = get_float_exception_flags(fpst);
  uVar2 = extract32(f,0x17,8);
  if (uVar2 != 0xff) {
    value = float32_round_to_int_aarch64(f,fpst);
    uVar2 = extract32(value,0x17,8);
    if (uVar2 < intsize + 0x7eU) {
      return value;
    }
    if (uVar2 == intsize + 0x7eU) {
      uVar2 = extract32(value,0x1f,1);
      uVar3 = extract32(value,0,0x17);
      if ((uVar2 != 0) && (uVar3 == 0)) {
        return value;
      }
    }
  }
  set_float_exception_flags(uVar1 | 1,fpst);
  return (intsize + 0x17e) * 0x800000;
}

Assistant:

static float32 frint_s(float32 f, float_status *fpst, int intsize)
{
    int old_flags = get_float_exception_flags(fpst);
    uint32_t exp = extract32(f, 23, 8);

    if (unlikely(exp == 0xff)) {
        /* NaN or Inf.  */
        goto overflow;
    }

    /* Round and re-extract the exponent.  */
    f = float32_round_to_int(f, fpst);
    exp = extract32(f, 23, 8);

    /* Validate the range of the result.  */
    if (exp < 126 + intsize) {
        /* abs(F) <= INT{N}_MAX */
        return f;
    }
    if (exp == 126 + intsize) {
        uint32_t sign = extract32(f, 31, 1);
        uint32_t frac = extract32(f, 0, 23);
        if (sign && frac == 0) {
            /* F == INT{N}_MIN */
            return f;
        }
    }

 overflow:
    /*
     * Raise Invalid and return INT{N}_MIN as a float.  Revert any
     * inexact exception float32_round_to_int may have raised.
     */
    set_float_exception_flags(old_flags | float_flag_invalid, fpst);
    return (0x100u + 126u + intsize) << 23;
}